

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool op_store_rr(DisasContext_conflict1 *s,arg_ldst_rr *a,MemOp mop,int mem_idx)

{
  TCGContext_conflict1 *tcg_ctx_00;
  ISSInfo IVar1;
  TCGv_i32 a32;
  TCGv_i32 val;
  TCGv_i32 tmp;
  TCGv_i32 addr;
  ISSInfo issinfo;
  TCGContext_conflict1 *tcg_ctx;
  int mem_idx_local;
  MemOp mop_local;
  arg_ldst_rr *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  IVar1 = make_issinfo(s,a->rt,a->p != 0,a->w != 0);
  a32 = op_addr_rr_pre(s,a);
  val = load_reg(s,a->rt);
  gen_aa32_st_i32(s,val,a32,mem_idx,mop | s->be_data);
  disas_set_da_iss(s,mop,IVar1 | ISSIsWrite);
  tcg_temp_free_i32(tcg_ctx_00,val);
  op_addr_rr_post(s,a,a32,0);
  return true;
}

Assistant:

static bool op_store_rr(DisasContext *s, arg_ldst_rr *a,
                        MemOp mop, int mem_idx)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    ISSInfo issinfo = make_issinfo(s, a->rt, a->p, a->w) | ISSIsWrite;
    TCGv_i32 addr, tmp;

    addr = op_addr_rr_pre(s, a);

    tmp = load_reg(s, a->rt);
    gen_aa32_st_i32(s, tmp, addr, mem_idx, mop | s->be_data);
    disas_set_da_iss(s, mop, issinfo);
    tcg_temp_free_i32(tcg_ctx, tmp);

    op_addr_rr_post(s, a, addr, 0);
    return true;
}